

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CMacroTable::Add(CMacroTable *this,char *nnaam,char **p)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CStringsList *this_00;
  EStatus type;
  _Base_ptr p_Var4;
  CStringsList *pCVar5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>,_bool>
  pVar7;
  reference rVar8;
  allocator<char> local_71;
  _Base_ptr local_70;
  CMacroTableEntry local_68;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,nnaam,&local_71);
  local_68.args = (CStringsList *)0x0;
  local_68.body = (CStringsList *)0x0;
  pVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CMacroTableEntry>_>_>
          ::try_emplace<CMacroTableEntry>(&this->macs,&local_50,&local_68);
  CMacroTableEntry::~CMacroTableEntry(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pcVar3 = "Duplicate macroname";
    type = PASS3;
  }
  else {
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->used,(ulong)((byte)*nnaam & 0x7f));
    *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
    p_Var4 = pVar7.first._M_node._M_node + 2;
    pCVar5 = (CStringsList *)0x0;
    local_70 = pVar7.first._M_node._M_node;
    do {
      pcVar3 = GetID(p);
      if (pcVar3 == (char *)0x0) {
        if ((pass == 1) && ((pCVar5 != (CStringsList *)0x0 || (**p != '\0')))) {
          Error("Illegal argument name",*p,EARLY);
        }
        SkipToEol(p);
        break;
      }
      if ((pass == 1) && (bVar1 = CStringsList::contains(*(CStringsList **)p_Var4,pcVar3), bVar1)) {
        Error("Duplicate argument name",pcVar3,EARLY);
      }
      this_00 = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this_00,pcVar3,(CStringsList *)0x0);
      p_Var6 = (_Base_ptr)&pCVar5->next;
      if (*(CStringsList **)p_Var4 == (CStringsList *)0x0) {
        p_Var6 = p_Var4;
      }
      *(CStringsList **)p_Var6 = this_00;
      bVar1 = anyComma(p);
      pCVar5 = this_00;
    } while (bVar1);
    if ((pass == 1) && (**p != '\0')) {
      Error("Unexpected",*p,EARLY);
    }
    ListFile(false);
    iVar2 = ReadFileToCStringsList((CStringsList **)&local_70[2]._M_parent,"endm");
    if (iVar2 != 0) {
      return;
    }
    pcVar3 = "Unexpected end of macro";
    type = EARLY;
    nnaam = (char *)0x0;
  }
  Error(pcVar3,nnaam,type);
  return;
}

Assistant:

void CMacroTable::Add(const char* nnaam, char*& p) {
	auto [add_it, is_new] = macs.try_emplace(nnaam, CMacroTableEntry());
	if (!is_new) {
		Error("Duplicate macroname", nnaam);
		return;
	}
	used[nnaam[0] & 127] = true;
	CStringsList* last = nullptr;
	do {
		char* n = GetID(p);
		if (!n) {
			// either EOL when no previous argument, or valid name is required after comma (2nd+ loop)
			if ((1 == pass) && (last || *p)) Error("Illegal argument name", p, EARLY);
			SkipToEol(p);
			break;
		}
		if ((1 == pass) && CStringsList::contains(add_it->second.args, n)) {
			Error("Duplicate argument name", n, EARLY);
		}
		CStringsList* argname = new CStringsList(n);
		if (!add_it->second.args) {
			add_it->second.args = argname;	// first argument name, make it head of list
		} else {
			last->next = argname;
		}
		last = argname;
	} while (anyComma(p));
	if ((1 == pass) && *p) {
		Error("Unexpected", p, EARLY);
	}
	ListFile();
	if (!ReadFileToCStringsList(add_it->second.body, "endm")) {
		Error("Unexpected end of macro", NULL, EARLY);
	}
}